

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O0

bool __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::IsFreeOrDecommitted
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,void *address)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  uint index;
  undefined8 *in_FS_OFFSET;
  bool local_29;
  uint base;
  void *address_local;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this_local;
  
  bVar2 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::IsInSegment
                    (&this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>,address);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.h"
                       ,0x153,"(this->IsInSegment(address))","this->IsInSegment(address)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  index = GetBitRangeBase(this,address);
  BVar3 = TestInDecommitPagesBitVector(this,index);
  local_29 = true;
  if (BVar3 == '\0') {
    BVar3 = TestInFreePagesBitVector(this,index);
    local_29 = BVar3 != '\0';
  }
  return local_29;
}

Assistant:

bool IsFreeOrDecommitted(void* address) const
    {
        Assert(this->IsInSegment(address));

        uint base = GetBitRangeBase(address);
        return this->TestInDecommitPagesBitVector(base) || this->TestInFreePagesBitVector(base);
    }